

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void __thiscall
phosg::RedBoldTerminalGuard::RedBoldTerminalGuard
          (RedBoldTerminalGuard *this,function<void_(const_void_*,_unsigned_long)> *write_data,
          bool active)

{
  char *__args;
  size_type __args_1;
  undefined1 local_40 [8];
  string e;
  bool active_local;
  function<void_(const_void_*,_unsigned_long)> *write_data_local;
  RedBoldTerminalGuard *this_local;
  
  e.field_2._M_local_buf[0xf] = active;
  ::std::function<void_(const_void_*,_unsigned_long)>::function(&this->write_data,write_data);
  this->active = (bool)(e.field_2._M_local_buf[0xf] & 1);
  if ((this->active & 1U) != 0) {
    format_color_escape_abi_cxx11_((string *)local_40,BOLD,0x1f,0xffffffff);
    __args = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40);
    __args_1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
              (&this->write_data,__args,__args_1);
    ::std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

RedBoldTerminalGuard(function<void(const void*, size_t)> write_data, bool active = true)
      : write_data(write_data),
        active(active) {
    if (this->active) {
      string e = format_color_escape(
          TerminalFormat::BOLD, TerminalFormat::FG_RED, TerminalFormat::END);
      this->write_data(e.data(), e.size());
    }
  }